

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_gen.cc
# Opt level: O3

void __thiscall
google::protobuf::internal::TailCallTableInfo::TailCallTableInfo
          (TailCallTableInfo *this,Descriptor *descriptor,MessageOptions *message_options,
          Span<const_google::protobuf::internal::TailCallTableInfo::FieldOptions> ordered_fields)

{
  vector<google::protobuf::internal::TailCallTableInfo::FastFieldInfo,_std::allocator<google::protobuf::internal::TailCallTableInfo::FastFieldInfo>_>
  *pvVar1;
  vector<google::protobuf::internal::TailCallTableInfo::AuxEntry,_std::allocator<google::protobuf::internal::TailCallTableInfo::AuxEntry>_>
  *pvVar2;
  vector<google::protobuf::internal::TailCallTableInfo::FieldEntryInfo,_std::allocator<google::protobuf::internal::TailCallTableInfo::FieldEntryInfo>_>
  *pvVar3;
  TailCallTableInfo *pTVar4;
  pointer pFVar5;
  undefined4 uVar6;
  int iVar7;
  MessageOptions *pMVar8;
  FieldOptions *pFVar9;
  pointer puVar10;
  pointer puVar11;
  pointer pAVar12;
  pointer pFVar13;
  FieldDescriptor *field;
  undefined1 auVar14 [16];
  undefined8 uVar15;
  Span<const_google::protobuf::internal::TailCallTableInfo::FieldOptions> fields;
  Span<const_google::protobuf::internal::TailCallTableInfo::FieldOptions> fields_00;
  vector<google::protobuf::internal::TailCallTableInfo::AuxEntry,_std::allocator<google::protobuf::internal::TailCallTableInfo::AuxEntry>_>
  *pvVar16;
  undefined1 auVar17 [8];
  pointer pSVar18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  undefined2 uVar22;
  float fVar23;
  undefined1 auVar24 [8];
  bool bVar25;
  char cVar26;
  byte extraout_AL;
  uint32_t uVar27;
  uint32_t uVar28;
  uint uVar29;
  TailCallTableInfo *pTVar30;
  optional<unsigned_int> oVar31;
  bool *pbVar32;
  variant<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
  *pvVar33;
  EnumDescriptor *enum_type;
  variant_alternative_t<1UL,_variant<Empty,_Field,_NonField>_> *pvVar34;
  Nonnull<const_char_*> pcVar35;
  byte bVar36;
  uint8_t uVar37;
  undefined1 uVar38;
  TailCallTableInfo *pTVar39;
  byte bVar40;
  ulong uVar41;
  long lVar42;
  pointer pFVar43;
  uint uVar44;
  FieldOptions **ppFVar45;
  TailCallTableInfo *pTVar46;
  ulong uVar47;
  unsigned_long v1;
  pointer pFVar48;
  TcParseFunction TVar49;
  ulong uVar50;
  undefined1 *puVar51;
  ulong uVar52;
  long lVar53;
  pointer pFVar54;
  Span<const_google::protobuf::internal::TailCallTableInfo::FieldEntryInfo> entries;
  Span<const_google::protobuf::internal::TailCallTableInfo::FieldOptions> ordered_fields_00;
  Span<const_google::protobuf::internal::TailCallTableInfo::FieldEntryInfo> entries_00;
  Span<const_google::protobuf::internal::TailCallTableInfo::FieldOptions> ordered_fields_01;
  int32_t first;
  FastFieldInfo fast_fields [32];
  undefined7 in_stack_fffffffffffffb18;
  undefined1 in_stack_fffffffffffffb1f;
  FieldDescriptor *in_stack_fffffffffffffb20;
  FieldDescriptor *pFVar55;
  NumToEntryTable local_4c8;
  pointer local_4a8;
  vector<google::protobuf::internal::TailCallTableInfo::AuxEntry,_std::allocator<google::protobuf::internal::TailCallTableInfo::AuxEntry>_>
  *local_4a0;
  TailCallTableInfo *local_498;
  TailCallTableInfo *local_490;
  Descriptor *local_488;
  uint32_t local_480;
  uint32_t local_47c;
  ulong local_478;
  Descriptor *local_470;
  variant<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
  *local_468;
  FieldDescriptor *local_460;
  vector<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock,_std::allocator<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock>_>
  local_458;
  undefined1 local_438 [8];
  undefined1 auStack_430 [16];
  pointer apSStack_420 [126];
  
  auVar17 = local_438;
  pFVar48 = (pointer)ordered_fields.len_;
  pTVar46 = (TailCallTableInfo *)ordered_fields.ptr_;
  (this->aux_entries).
  super__Vector_base<google::protobuf::internal::TailCallTableInfo::AuxEntry,_std::allocator<google::protobuf::internal::TailCallTableInfo::AuxEntry>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->aux_entries).
  super__Vector_base<google::protobuf::internal::TailCallTableInfo::AuxEntry,_std::allocator<google::protobuf::internal::TailCallTableInfo::AuxEntry>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->field_entries).
  super__Vector_base<google::protobuf::internal::TailCallTableInfo::FieldEntryInfo,_std::allocator<google::protobuf::internal::TailCallTableInfo::FieldEntryInfo>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->field_entries).
  super__Vector_base<google::protobuf::internal::TailCallTableInfo::FieldEntryInfo,_std::allocator<google::protobuf::internal::TailCallTableInfo::FieldEntryInfo>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->fast_path_fields).
  super__Vector_base<google::protobuf::internal::TailCallTableInfo::FastFieldInfo,_std::allocator<google::protobuf::internal::TailCallTableInfo::FastFieldInfo>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->field_entries).
  super__Vector_base<google::protobuf::internal::TailCallTableInfo::FieldEntryInfo,_std::allocator<google::protobuf::internal::TailCallTableInfo::FieldEntryInfo>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->fast_path_fields).
  super__Vector_base<google::protobuf::internal::TailCallTableInfo::FastFieldInfo,_std::allocator<google::protobuf::internal::TailCallTableInfo::FastFieldInfo>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->fast_path_fields).
  super__Vector_base<google::protobuf::internal::TailCallTableInfo::FastFieldInfo,_std::allocator<google::protobuf::internal::TailCallTableInfo::FastFieldInfo>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->aux_entries).
  super__Vector_base<google::protobuf::internal::TailCallTableInfo::AuxEntry,_std::allocator<google::protobuf::internal::TailCallTableInfo::AuxEntry>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->num_to_entry_table).blocks.
  super__Vector_base<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock,_std::allocator<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->num_to_entry_table).blocks.
  super__Vector_base<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock,_std::allocator<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->num_to_entry_table).blocks.
  super__Vector_base<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock,_std::allocator<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->field_name_data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->field_name_data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->field_name_data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pMVar8 = descriptor->options_;
  TVar49 = kDiscardEverythingFallback;
  if (((pMVar8->field_0)._impl_.map_entry_ == false) &&
     (TVar49 = kReflectionFallback, message_options->uses_codegen == true)) {
    uVar41 = (ulong)descriptor->field_count_;
    if ((long)uVar41 < 1) {
LAB_00430fa6:
      TVar49 = message_options->is_lite | kGenericFallback;
    }
    else if ((descriptor->fields_->options_->field_0)._impl_.weak_ == false) {
      ppFVar45 = &descriptor->fields_[1].options_;
      uVar50 = 1;
      do {
        uVar52 = uVar50;
        if (uVar41 == uVar52) break;
        pFVar9 = *ppFVar45;
        ppFVar45 = ppFVar45 + 0xb;
        uVar50 = uVar52 + 1;
      } while ((pFVar9->field_0)._impl_.weak_ != true);
      if (uVar41 <= uVar52) goto LAB_00430fa6;
    }
  }
  pvVar1 = &this->fast_path_fields;
  pvVar2 = &this->aux_entries;
  this->fallback_function = TVar49;
  local_4a8 = pFVar48;
  local_4a0 = pvVar2;
  local_498 = pTVar46;
  local_488 = descriptor;
  local_470 = (Descriptor *)message_options;
  if ((pMVar8->field_0)._impl_.message_set_wire_format_ == true) {
    if (pFVar48 != (pointer)0x0) {
LAB_004321d7:
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)local_438,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_gen.cc"
                 ,0x3a2,"ordered_fields.empty()");
LAB_00432268:
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)local_438);
    }
    if (message_options->uses_codegen == true) {
      local_438[0] = 'v' - message_options->is_lite;
      auVar24 = local_438;
      local_438._6_2_ = auVar17._6_2_;
      local_438._0_2_ = auVar24._0_2_;
      local_438._2_4_ = 0;
      apSStack_420[0] = (pointer)CONCAT71(apSStack_420[0]._1_7_,2);
      std::
      vector<google::protobuf::internal::TailCallTableInfo::FastFieldInfo,std::allocator<google::protobuf::internal::TailCallTableInfo::FastFieldInfo>>
      ::_M_assign_aux<google::protobuf::internal::TailCallTableInfo::FastFieldInfo_const*>
                ((vector<google::protobuf::internal::TailCallTableInfo::FastFieldInfo,std::allocator<google::protobuf::internal::TailCallTableInfo::FastFieldInfo>>
                  *)pvVar1,local_438);
      local_438._0_4_ = 8;
      auStack_430._0_8_ =
           (__uniq_ptr_impl<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
            )0x0;
      std::
      vector<google::protobuf::internal::TailCallTableInfo::AuxEntry,std::allocator<google::protobuf::internal::TailCallTableInfo::AuxEntry>>
      ::_M_assign_aux<google::protobuf::internal::TailCallTableInfo::AuxEntry_const*>
                ((vector<google::protobuf::internal::TailCallTableInfo::AuxEntry,std::allocator<google::protobuf::internal::TailCallTableInfo::AuxEntry>>
                  *)pvVar2,local_438);
    }
    else {
      if (message_options->is_lite == true) {
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)local_438,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_gen.cc"
                   ,0x3ac,"!message_options.is_lite");
        goto LAB_00432268;
      }
      auStack_430._8_8_ = (pointer)0x0;
      apSStack_420[0] = (pointer)0x2;
      local_438 = (undefined1  [8])0x77;
      auStack_430._0_8_ = (LogMessageData *)0x0;
      std::
      vector<google::protobuf::internal::TailCallTableInfo::FastFieldInfo,std::allocator<google::protobuf::internal::TailCallTableInfo::FastFieldInfo>>
      ::_M_assign_aux<google::protobuf::internal::TailCallTableInfo::FastFieldInfo_const*>
                ((vector<google::protobuf::internal::TailCallTableInfo::FastFieldInfo,std::allocator<google::protobuf::internal::TailCallTableInfo::FastFieldInfo>>
                  *)pvVar1,local_438);
    }
    this->table_size_log2 = 0;
    auVar14._8_8_ = 0;
    auVar14._0_8_ = message_options;
    anon_unknown_36::MakeNumToEntryTable
              ((NumToEntryTable *)local_438,(anon_unknown_36 *)local_498,
               (Span<const_google::protobuf::internal::TailCallTableInfo::FieldOptions>)
               (auVar14 << 0x40));
    (this->num_to_entry_table).skipmap32 = local_438._0_4_;
    local_4c8.blocks.
    super__Vector_base<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock,_std::allocator<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         (this->num_to_entry_table).blocks.
         super__Vector_base<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock,_std::allocator<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    (this->num_to_entry_table).blocks.
    super__Vector_base<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock,_std::allocator<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = apSStack_420[0];
    local_4c8._0_8_ =
         (this->num_to_entry_table).blocks.
         super__Vector_base<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock,_std::allocator<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock>_>
         ._M_impl.super__Vector_impl_data._M_start;
    local_4c8.blocks.
    super__Vector_base<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock,_std::allocator<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (this->num_to_entry_table).blocks.
         super__Vector_base<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock,_std::allocator<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    (this->num_to_entry_table).blocks.
    super__Vector_base<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock,_std::allocator<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)auStack_430._0_8_;
    (this->num_to_entry_table).blocks.
    super__Vector_base<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock,_std::allocator<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)auStack_430._8_8_;
    auStack_430._0_8_ =
         (__uniq_ptr_impl<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
          )0x0;
    auStack_430._8_8_ = (pointer)0x0;
    apSStack_420[0] = (pointer)0x0;
    std::
    vector<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock,_std::allocator<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock>_>
    ::~vector((vector<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock,_std::allocator<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock>_>
               *)&local_4c8);
    std::
    vector<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock,_std::allocator<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock>_>
    ::~vector((vector<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock,_std::allocator<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock>_>
               *)auStack_430);
    pFVar54 = (this->field_entries).
              super__Vector_base<google::protobuf::internal::TailCallTableInfo::FieldEntryInfo,_std::allocator<google::protobuf::internal::TailCallTableInfo::FieldEntryInfo>_>
              ._M_impl.super__Vector_impl_data._M_start;
    entries.len_ = ((long)(this->field_entries).
                          super__Vector_base<google::protobuf::internal::TailCallTableInfo::FieldEntryInfo,_std::allocator<google::protobuf::internal::TailCallTableInfo::FieldEntryInfo>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)pFVar54 >> 3) *
                   -0x5555555555555555;
    fields.ptr_._7_1_ = in_stack_fffffffffffffb1f;
    fields.ptr_._0_7_ = in_stack_fffffffffffffb18;
    fields.len_ = (size_type)in_stack_fffffffffffffb20;
    entries.ptr_ = pFVar54;
    anon_unknown_36::GenerateFieldNames
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_438,local_488,entries,
               (MessageOptions *)pFVar48,fields);
    puVar10 = (this->field_name_data).
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start;
    puVar11 = (this->field_name_data).
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage;
    (this->field_name_data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)local_438;
    (this->field_name_data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)auStack_430._0_8_;
    (this->field_name_data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)auStack_430._8_8_;
    local_438 = (undefined1  [8])0x0;
    auStack_430._0_8_ =
         (__uniq_ptr_impl<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
          )0x0;
    auStack_430._8_8_ = (pointer)0x0;
    if (puVar10 == (pointer)0x0) {
      return;
    }
    operator_delete(puVar10,(long)puVar11 - (long)puVar10);
    auVar17 = local_438;
    pSVar18 = (pointer)auStack_430._8_8_;
    goto joined_r0x0043219b;
  }
  uVar50 = (long)pFVar48 * 0x20;
  pTVar4 = (TailCallTableInfo *)(&pTVar46->fallback_function + uVar50);
  pTVar30 = pTVar46;
  pTVar39 = pTVar46;
  uVar41 = uVar50;
  if (pFVar48 != (pointer)0x0) {
    do {
      if (uVar41 - 0x20 == 0) goto LAB_0043108f;
      pTVar30 = (TailCallTableInfo *)&pTVar39->field_entries;
      lVar53 = *(long *)pTVar39;
      pvVar3 = &pTVar39->field_entries;
      pTVar39 = pTVar30;
      uVar41 = uVar41 - 0x20;
    } while (*(int *)(lVar53 + 4) <=
             *(int *)((long)&((pvVar3->
                              super__Vector_base<google::protobuf::internal::TailCallTableInfo::FieldEntryInfo,_std::allocator<google::protobuf::internal::TailCallTableInfo::FieldEntryInfo>_>
                              )._M_impl.super__Vector_impl_data._M_start)->field + 4));
  }
  if (pTVar30 != pTVar4) {
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)local_438,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_gen.cc"
               ,0x3bf,
               "std::is_sorted(ordered_fields.begin(), ordered_fields.end(), [](const auto& lhs, const auto& rhs) { return lhs.field->number() < rhs.field->number(); })"
              );
    goto LAB_00432268;
  }
LAB_0043108f:
  lVar53 = (long)pFVar48 >> 2;
  pTVar30 = pTVar46;
  if (0 < lVar53) {
    pTVar30 = (TailCallTableInfo *)(&pTVar46->fallback_function + (uVar50 & 0xffffffffffffff80));
    lVar42 = lVar53 + 1;
    pTVar39 = (TailCallTableInfo *)
              &(pTVar46->aux_entries).
               super__Vector_base<google::protobuf::internal::TailCallTableInfo::AuxEntry,_std::allocator<google::protobuf::internal::TailCallTableInfo::AuxEntry>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    do {
      if (*(char *)((long)&pTVar39[-1].num_to_entry_table.blocks.
                           super__Vector_base<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock,_std::allocator<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock>_>
                           ._M_impl.super__Vector_impl_data._M_finish + 2) != '\0') {
        pTVar39 = (TailCallTableInfo *)&pTVar39[-1].num_to_entry_table;
        goto LAB_00431290;
      }
      if (*(char *)((long)&pTVar39[-1].field_name_data.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_end_of_storage + 2) != '\0') {
        pTVar39 = (TailCallTableInfo *)&pTVar39[-1].field_name_data;
        goto LAB_00431290;
      }
      if (*(char *)((long)&(pTVar39->fast_path_fields).
                           super__Vector_base<google::protobuf::internal::TailCallTableInfo::FastFieldInfo,_std::allocator<google::protobuf::internal::TailCallTableInfo::FastFieldInfo>_>
                           ._M_impl.super__Vector_impl_data._M_finish + 2) != '\0')
      goto LAB_00431290;
      if (*(char *)((long)&(pTVar39->field_entries).
                           super__Vector_base<google::protobuf::internal::TailCallTableInfo::FieldEntryInfo,_std::allocator<google::protobuf::internal::TailCallTableInfo::FieldEntryInfo>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage + 2) != '\0') {
        pTVar39 = (TailCallTableInfo *)&pTVar39->field_entries;
        goto LAB_00431290;
      }
      lVar42 = lVar42 + -1;
      pTVar39 = (TailCallTableInfo *)
                &(pTVar39->field_name_data).
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
    } while (1 < lVar42);
    pFVar48 = (pointer)(ulong)((uint)ordered_fields.len_ & 3);
  }
  if (pFVar48 == (pointer)0x1) {
LAB_00431287:
    pTVar39 = pTVar30;
    if (*(char *)((long)&(pTVar30->fast_path_fields).
                         super__Vector_base<google::protobuf::internal::TailCallTableInfo::FastFieldInfo,_std::allocator<google::protobuf::internal::TailCallTableInfo::FastFieldInfo>_>
                         ._M_impl.super__Vector_impl_data._M_finish + 2) != '\0') goto LAB_00431290;
  }
  else {
    if (pFVar48 == (pointer)0x2) {
LAB_0043111b:
      pTVar39 = pTVar30;
      if (*(char *)((long)&(pTVar30->fast_path_fields).
                           super__Vector_base<google::protobuf::internal::TailCallTableInfo::FastFieldInfo,_std::allocator<google::protobuf::internal::TailCallTableInfo::FastFieldInfo>_>
                           ._M_impl.super__Vector_impl_data._M_finish + 2) == '\0') {
        pTVar30 = (TailCallTableInfo *)&pTVar30->field_entries;
        goto LAB_00431287;
      }
    }
    else {
      if (pFVar48 != (pointer)0x3) goto LAB_004312b9;
      pTVar39 = pTVar30;
      if (*(char *)((long)&(pTVar30->fast_path_fields).
                           super__Vector_base<google::protobuf::internal::TailCallTableInfo::FastFieldInfo,_std::allocator<google::protobuf::internal::TailCallTableInfo::FastFieldInfo>_>
                           ._M_impl.super__Vector_impl_data._M_finish + 2) == '\0') {
        pTVar30 = (TailCallTableInfo *)&pTVar30->field_entries;
        goto LAB_0043111b;
      }
    }
LAB_00431290:
    if (pTVar39 != pTVar4) {
      pTVar46 = (TailCallTableInfo *)0x1;
      std::
      vector<google::protobuf::internal::TailCallTableInfo::AuxEntry,_std::allocator<google::protobuf::internal::TailCallTableInfo::AuxEntry>_>
      ::resize(pvVar2,1);
      pAVar12 = (pvVar2->
                super__Vector_base<google::protobuf::internal::TailCallTableInfo::AuxEntry,_std::allocator<google::protobuf::internal::TailCallTableInfo::AuxEntry>_>
                )._M_impl.super__Vector_impl_data._M_start;
      pAVar12->type = kInlinedStringDonatedOffset;
      (pAVar12->field_1).field = (FieldDescriptor *)0x0;
    }
  }
LAB_004312b9:
  pvVar2 = local_4a0;
  pTVar30 = local_498;
  pFVar48 = local_4a8;
  if (0 < lVar53) {
    pTVar30 = (TailCallTableInfo *)(&local_498->fallback_function + (uVar50 & 0xffffffffffffff80));
    lVar53 = lVar53 + 1;
    pvVar16 = &local_498->aux_entries;
    do {
      if (*(undefined1 *)
           ((long)&(((vector<google::protobuf::internal::TailCallTableInfo::FastFieldInfo,_std::allocator<google::protobuf::internal::TailCallTableInfo::FastFieldInfo>_>
                      *)(pvVar16 + -2))->
                   super__Vector_base<google::protobuf::internal::TailCallTableInfo::FastFieldInfo,_std::allocator<google::protobuf::internal::TailCallTableInfo::FastFieldInfo>_>
                   )._M_impl.super__Vector_impl_data._M_finish + 5) != '\0') {
        pTVar39 = (TailCallTableInfo *)((long)(pvVar16 + -3) + 0x10);
        goto LAB_00431358;
      }
      if (*(undefined1 *)
           ((long)&(((vector<google::protobuf::internal::TailCallTableInfo::FieldEntryInfo,_std::allocator<google::protobuf::internal::TailCallTableInfo::FieldEntryInfo>_>
                      *)(pvVar16 + -1))->
                   super__Vector_base<google::protobuf::internal::TailCallTableInfo::FieldEntryInfo,_std::allocator<google::protobuf::internal::TailCallTableInfo::FieldEntryInfo>_>
                   )._M_impl.super__Vector_impl_data._M_end_of_storage + 5) != '\0') {
        pTVar39 = (TailCallTableInfo *)(pvVar16 + -1);
        goto LAB_00431358;
      }
      pTVar39 = (TailCallTableInfo *)
                &(pvVar16->
                 super__Vector_base<google::protobuf::internal::TailCallTableInfo::AuxEntry,_std::allocator<google::protobuf::internal::TailCallTableInfo::AuxEntry>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
      if (((NumToEntryTable *)(pvVar16 + 1))->field_0x5 != '\0') goto LAB_00431358;
      if (*(char *)((long)(pvVar16 + 2) + 0xd) != '\0') {
        pTVar39 = (TailCallTableInfo *)
                  ((long)&(((NumToEntryTable *)(pvVar16 + 1))->blocks).
                          super__Vector_base<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock,_std::allocator<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock>_>
                          ._M_impl.super__Vector_impl_data + 8);
        goto LAB_00431358;
      }
      lVar53 = lVar53 + -1;
      pvVar16 = (vector<google::protobuf::internal::TailCallTableInfo::AuxEntry,_std::allocator<google::protobuf::internal::TailCallTableInfo::AuxEntry>_>
                 *)((long)(pvVar16 + 5) + 8);
    } while (1 < lVar53);
    pFVar48 = (pointer)(ulong)((uint)local_4a8 & 3);
  }
  if (pFVar48 == (pointer)0x1) {
LAB_004321c0:
    pTVar39 = pTVar30;
    if (*(char *)((long)&(pTVar30->fast_path_fields).
                         super__Vector_base<google::protobuf::internal::TailCallTableInfo::FastFieldInfo,_std::allocator<google::protobuf::internal::TailCallTableInfo::FastFieldInfo>_>
                         ._M_impl.super__Vector_impl_data._M_finish + 5) != '\0') goto LAB_00431358;
  }
  else {
    if (pFVar48 == (pointer)0x2) {
LAB_0043132a:
      pTVar39 = pTVar30;
      if (*(char *)((long)&(pTVar30->fast_path_fields).
                           super__Vector_base<google::protobuf::internal::TailCallTableInfo::FastFieldInfo,_std::allocator<google::protobuf::internal::TailCallTableInfo::FastFieldInfo>_>
                           ._M_impl.super__Vector_impl_data._M_finish + 5) == '\0') {
        pTVar30 = (TailCallTableInfo *)&pTVar30->field_entries;
        goto LAB_004321c0;
      }
    }
    else {
      if (pFVar48 != (pointer)0x3) goto LAB_0043138e;
      pTVar39 = pTVar30;
      if (*(char *)((long)&(pTVar30->fast_path_fields).
                           super__Vector_base<google::protobuf::internal::TailCallTableInfo::FastFieldInfo,_std::allocator<google::protobuf::internal::TailCallTableInfo::FastFieldInfo>_>
                           ._M_impl.super__Vector_impl_data._M_finish + 5) == '\0') {
        pTVar30 = (TailCallTableInfo *)&pTVar30->field_entries;
        goto LAB_0043132a;
      }
    }
LAB_00431358:
    if (pTVar39 != pTVar4) {
      pTVar46 = (TailCallTableInfo *)0x3;
      std::
      vector<google::protobuf::internal::TailCallTableInfo::AuxEntry,_std::allocator<google::protobuf::internal::TailCallTableInfo::AuxEntry>_>
      ::resize(local_4a0,3);
      pAVar12 = (pvVar2->
                super__Vector_base<google::protobuf::internal::TailCallTableInfo::AuxEntry,_std::allocator<google::protobuf::internal::TailCallTableInfo::AuxEntry>_>
                )._M_impl.super__Vector_impl_data._M_start;
      pAVar12[1].type = kSplitOffset;
      pAVar12[1].field_1.field = (FieldDescriptor *)0x0;
      pAVar12 = (pvVar2->
                super__Vector_base<google::protobuf::internal::TailCallTableInfo::AuxEntry,_std::allocator<google::protobuf::internal::TailCallTableInfo::AuxEntry>_>
                )._M_impl.super__Vector_impl_data._M_start;
      pAVar12[2].type = kSplitSizeof;
      pAVar12[2].field_1.field = (FieldDescriptor *)0x0;
    }
  }
LAB_0043138e:
  ordered_fields_01.len_ = (size_type)pvVar2;
  ordered_fields_01.ptr_ = local_4a8;
  pFVar48 = local_4a8;
  BuildFieldEntries((vector<google::protobuf::internal::TailCallTableInfo::FieldEntryInfo,_std::allocator<google::protobuf::internal::TailCallTableInfo::FieldEntryInfo>_>
                     *)local_438,pTVar46,local_470,(MessageOptions *)local_498,ordered_fields_01,
                    (vector<google::protobuf::internal::TailCallTableInfo::AuxEntry,_std::allocator<google::protobuf::internal::TailCallTableInfo::AuxEntry>_>
                     *)CONCAT17(in_stack_fffffffffffffb1f,in_stack_fffffffffffffb18));
  pFVar54 = (this->field_entries).
            super__Vector_base<google::protobuf::internal::TailCallTableInfo::FieldEntryInfo,_std::allocator<google::protobuf::internal::TailCallTableInfo::FieldEntryInfo>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pFVar13 = (this->field_entries).
            super__Vector_base<google::protobuf::internal::TailCallTableInfo::FieldEntryInfo,_std::allocator<google::protobuf::internal::TailCallTableInfo::FieldEntryInfo>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (this->field_entries).
  super__Vector_base<google::protobuf::internal::TailCallTableInfo::FieldEntryInfo,_std::allocator<google::protobuf::internal::TailCallTableInfo::FieldEntryInfo>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)local_438;
  (this->field_entries).
  super__Vector_base<google::protobuf::internal::TailCallTableInfo::FieldEntryInfo,_std::allocator<google::protobuf::internal::TailCallTableInfo::FieldEntryInfo>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)auStack_430._0_8_;
  (this->field_entries).
  super__Vector_base<google::protobuf::internal::TailCallTableInfo::FieldEntryInfo,_std::allocator<google::protobuf::internal::TailCallTableInfo::FieldEntryInfo>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)auStack_430._8_8_;
  local_438 = (undefined1  [8])0x0;
  auStack_430._0_8_ = (LogMessageData *)0x0;
  auStack_430._8_8_ = (pointer)0x0;
  if ((pFVar54 != (pointer)0x0) &&
     (operator_delete(pFVar54,(long)pFVar13 - (long)pFVar54), local_438 != (undefined1  [8])0x0)) {
    operator_delete((void *)local_438,auStack_430._8_8_ - (long)local_438);
  }
  oVar31 = GetEndGroupTag(local_488);
  lVar53 = 0x18;
  do {
    local_438[lVar53] = 0;
    lVar53 = lVar53 + 0x20;
  } while (lVar53 != 0x418);
  uVar29 = 0x20;
  if (((ulong)oVar31.super__Optional_base<unsigned_int,_true,_true>._M_payload.
              super__Optional_payload_base<unsigned_int> >> 0x20 & 1) == 0) {
    pbVar32 = (bool *)((long)&local_4a8->field + 1);
    uVar41 = (long)pbVar32 - ((ulong)pbVar32 >> 1 & 0x5555555555555555);
    uVar50 = (uVar41 >> 2 & 0x3333333333333333) + (uVar41 & 0x3333333333333333);
    uVar41 = 0x40;
    if (pbVar32 != (bool *)0x0) {
      uVar41 = 0x3f;
      if (pbVar32 != (bool *)0x0) {
        for (; (ulong)pbVar32 >> uVar41 == 0; uVar41 = uVar41 - 1) {
        }
      }
      uVar41 = uVar41 ^ 0x3f;
    }
    uVar52 = (ulong)(0x3f - (int)uVar41);
    if ((char)(((uVar50 >> 4) + uVar50 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101 >> 0x38) != '\x01')
    {
      uVar52 = 0x40 - uVar41;
    }
    uVar29 = 0x20;
    if (uVar52 < 5) {
      uVar29 = (uint)(1L << ((byte)uVar52 & 0x3f));
    }
  }
  uVar41 = (ulong)oVar31.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                  super__Optional_payload_base<unsigned_int> & 0x1ffffc000;
  uVar44 = 0;
  local_490 = this;
  if (uVar41 == 0x100000000) {
    uVar27 = TcParseTableBase::RecodeTagForFastParsing
                       (oVar31.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                        super__Optional_payload_base<unsigned_int>._M_payload);
    bVar36 = (byte)uVar41;
    uVar28 = TcParseTableBase::TagToIdx(uVar27,uVar29);
    uVar15 = local_4c8._0_8_;
    if (uVar29 <= uVar28) {
      internal::TailCallTableInfo();
LAB_0043227a:
      internal::TailCallTableInfo();
      bVar40 = extraout_AL;
LAB_0043227f:
      pcVar35 = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                          ((bool)bVar36,0xbf < bVar40,
                           "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED");
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_4c8,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                 ,0xb54,pcVar35);
      goto LAB_004322d8;
    }
    local_4c8.skipmap32._0_1_ =
         't' - (oVar31.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                super__Optional_payload_base<unsigned_int>._M_payload < 0x80);
    local_4c8.skipmap32._2_2_ = (uint16_t)uVar27;
    local_4c8._6_2_ = SUB82(uVar15,6);
    local_4c8._4_2_ =
         oVar31.super__Optional_base<unsigned_int,_true,_true>._M_payload.
         super__Optional_payload_base<unsigned_int>._M_payload._0_2_;
    std::
    variant<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
    ::operator=((variant<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
                 *)(local_438 + (ulong)uVar28 * 0x20),(NonField *)&local_4c8);
    uVar44 = 1 << ((byte)uVar28 & 0x1f);
  }
  pFVar54 = (local_490->field_entries).
            super__Vector_base<google::protobuf::internal::TailCallTableInfo::FieldEntryInfo,_std::allocator<google::protobuf::internal::TailCallTableInfo::FieldEntryInfo>_>
            ._M_impl.super__Vector_impl_data._M_start;
  local_478 = (ulong)uVar29;
  if ((local_490->field_entries).
      super__Vector_base<google::protobuf::internal::TailCallTableInfo::FieldEntryInfo,_std::allocator<google::protobuf::internal::TailCallTableInfo::FieldEntryInfo>_>
      ._M_impl.super__Vector_impl_data._M_finish != pFVar54) {
    puVar51 = (undefined1 *)
              ((long)&(local_498->fast_path_fields).
                      super__Vector_base<google::protobuf::internal::TailCallTableInfo::FastFieldInfo,_std::allocator<google::protobuf::internal::TailCallTableInfo::FastFieldInfo>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage + 4);
    lVar53 = 0;
    pFVar43 = (pointer)0x0;
    pFVar55 = in_stack_fffffffffffffb20;
    do {
      if (local_4a8 == pFVar43) {
        internal::TailCallTableInfo();
        goto LAB_004321d7;
      }
      field = *(FieldDescriptor **)((long)&pFVar54->field + lVar53);
      bVar25 = IsFieldTypeEligibleForFastParsing(field);
      in_stack_fffffffffffffb20 = pFVar55;
      if (((((bVar25) && (puVar51[-9] == '\0')) && (puVar51[-7] == '\0')) &&
          ((bVar25 = anon_unknown_36::HasLazyRep
                               (field,(FieldOptions *)(ulong)*(uint *)(puVar51 + -0xc)), !bVar25 ||
           (in_stack_fffffffffffffb20 = pFVar55, (bool)local_470->field_0x1 == true)))) &&
         (bVar25 = anon_unknown_36::HasLazyRep
                             (field,(FieldOptions *)(ulong)*(uint *)(puVar51 + -0xc)),
         in_stack_fffffffffffffb20 = pFVar55, !bVar25 || *(short *)(puVar51 + -0xc) != 0x400)) {
        uVar29 = (uint)*(ushort *)((long)&pFVar54->aux_idx + lVar53);
        bVar36 = field->type_;
        if (((bVar36 == 0xc) || (bVar36 == 9)) && (puVar51[-10] == '\x01')) {
          bVar40 = field->field_0x1;
          bVar36 = (bVar40 & 0x20) >> 5;
          if (0xbf < bVar40 != (bool)bVar36) goto LAB_0043227f;
          if ((bVar40 & 0x20) != 0) {
            absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                      ((LogMessageFatal *)&local_4c8,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_gen.cc"
                       ,0x124,"!field->is_repeated()");
            goto LAB_004322d8;
          }
          uVar29 = *(uint *)((long)&pFVar54->inlined_string_idx + lVar53);
        }
        if ((0x1f < *(int *)((long)&pFVar54->hasbit_idx + lVar53)) || (0xff < (int)uVar29))
        goto LAB_004315f8;
        local_460 = *(FieldDescriptor **)((long)&pFVar54->field + lVar53);
        local_47c = GetRecodedTagForFastParsing(local_460);
        local_480 = TcParseTableBase::TagToIdx(local_47c,(uint32_t)local_478);
        if ((uint)local_478 <= local_480) goto LAB_0043227a;
        lVar42 = (ulong)local_480 * 0x20;
        in_stack_fffffffffffffb20 = pFVar55;
        if ((*(char *)(apSStack_420 + (ulong)local_480 * 4) == '\x02') ||
           ((pvVar33 = (variant<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
                        *)(local_438 + lVar42),
            *(char *)(apSStack_420 + (ulong)local_480 * 4) == '\x01' &&
            (*(float *)(puVar51 + -0x10) <= *(float *)((long)apSStack_420 + lVar42 + -4)))))
        goto LAB_004315f8;
        in_stack_fffffffffffffb20 = *(FieldDescriptor **)((long)&pFVar54->field + lVar53);
        bVar36 = in_stack_fffffffffffffb20->type_;
        local_468 = pvVar33;
        if (0x11 < bVar36 - 1) {
          absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                    ((LogMessageFatal *)&local_4c8,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_gen.cc"
                     ,0xfa,"picked != TcParseFunction::kNone");
          goto LAB_004322d8;
        }
        in_stack_fffffffffffffb1f = *(undefined1 *)((long)&pFVar54->aux_idx + lVar53);
        switch((uint)bVar36) {
        default:
          bVar25 = FieldDescriptor::is_packed(in_stack_fffffffffffffb20);
          uVar38 = in_stack_fffffffffffffb1f;
          if (bVar25) {
            bVar25 = in_stack_fffffffffffffb20->number_ < 0x10;
            cVar26 = '*';
            in_stack_fffffffffffffb20 = pFVar55;
          }
          else {
            bVar36 = in_stack_fffffffffffffb20->field_0x1;
            bVar25 = (bool)((bVar36 & 0x20) >> 5);
            if (0xbf < bVar36 != bVar25) {
              pcVar35 = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                                  (bVar25,0xbf < bVar36,
                                   "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED");
              absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                        ((LogMessageFatal *)&local_4c8,
                         "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                         ,0xb54,pcVar35);
              goto LAB_004322d8;
            }
            if ((bVar36 & 0x20) == 0) {
              bVar25 = in_stack_fffffffffffffb20->number_ < 0x10;
              cVar26 = '&';
              in_stack_fffffffffffffb20 = pFVar55;
            }
            else {
              bVar25 = in_stack_fffffffffffffb20->number_ < 0x10;
              cVar26 = '(';
              in_stack_fffffffffffffb20 = pFVar55;
            }
          }
          break;
        case 2:
        case 7:
        case 0xf:
          bVar25 = FieldDescriptor::is_packed(in_stack_fffffffffffffb20);
          uVar38 = in_stack_fffffffffffffb1f;
          if (bVar25) {
            bVar25 = in_stack_fffffffffffffb20->number_ < 0x10;
            cVar26 = '$';
            in_stack_fffffffffffffb20 = pFVar55;
          }
          else {
            bVar36 = in_stack_fffffffffffffb20->field_0x1;
            bVar25 = (bool)((bVar36 & 0x20) >> 5);
            if (0xbf < bVar36 != bVar25) {
              pcVar35 = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                                  (bVar25,0xbf < bVar36,
                                   "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED");
              absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                        ((LogMessageFatal *)&local_4c8,
                         "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                         ,0xb54,pcVar35);
              goto LAB_004322d8;
            }
            if ((bVar36 & 0x20) == 0) {
              bVar25 = in_stack_fffffffffffffb20->number_ < 0x10;
              cVar26 = ' ';
              in_stack_fffffffffffffb20 = pFVar55;
            }
            else {
              bVar25 = in_stack_fffffffffffffb20->number_ < 0x10;
              cVar26 = '\"';
              in_stack_fffffffffffffb20 = pFVar55;
            }
          }
          break;
        case 3:
        case 4:
          bVar25 = FieldDescriptor::is_packed(in_stack_fffffffffffffb20);
          uVar38 = in_stack_fffffffffffffb1f;
          if (bVar25) {
            bVar25 = in_stack_fffffffffffffb20->number_ < 0x10;
            cVar26 = '\x12';
            in_stack_fffffffffffffb20 = pFVar55;
          }
          else {
            bVar36 = in_stack_fffffffffffffb20->field_0x1;
            bVar25 = (bool)((bVar36 & 0x20) >> 5);
            if (0xbf < bVar36 != bVar25) {
              pcVar35 = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                                  (bVar25,0xbf < bVar36,
                                   "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED");
              absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                        ((LogMessageFatal *)&local_4c8,
                         "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                         ,0xb54,pcVar35);
              goto LAB_004322d8;
            }
            if ((bVar36 & 0x20) == 0) {
              bVar25 = in_stack_fffffffffffffb20->number_ < 0x10;
              cVar26 = '\x0e';
              in_stack_fffffffffffffb20 = pFVar55;
            }
            else {
              bVar25 = in_stack_fffffffffffffb20->number_ < 0x10;
              cVar26 = '\x10';
              in_stack_fffffffffffffb20 = pFVar55;
            }
          }
          break;
        case 5:
        case 0xd:
          bVar25 = FieldDescriptor::is_packed(in_stack_fffffffffffffb20);
          if (bVar25) {
            iVar7 = in_stack_fffffffffffffb20->number_;
LAB_00431783:
            bVar25 = iVar7 < 0x10;
            cVar26 = '\f';
            uVar38 = in_stack_fffffffffffffb1f;
            in_stack_fffffffffffffb20 = pFVar55;
          }
          else {
            bVar36 = in_stack_fffffffffffffb20->field_0x1;
            bVar25 = (bool)((bVar36 & 0x20) >> 5);
            if (0xbf < bVar36 != bVar25) {
              pcVar35 = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                                  (bVar25,0xbf < bVar36,
                                   "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED");
              absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                        ((LogMessageFatal *)&local_4c8,
                         "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                         ,0xb54,pcVar35);
              goto LAB_004322d8;
            }
LAB_004319b2:
            uVar38 = in_stack_fffffffffffffb1f;
            if ((bVar36 & 0x20) == 0) {
              bVar25 = in_stack_fffffffffffffb20->number_ < 0x10;
              cVar26 = '\b';
              in_stack_fffffffffffffb20 = pFVar55;
            }
            else {
              bVar25 = in_stack_fffffffffffffb20->number_ < 0x10;
              cVar26 = '\n';
              in_stack_fffffffffffffb20 = pFVar55;
            }
          }
          break;
        case 8:
          bVar25 = FieldDescriptor::is_packed(in_stack_fffffffffffffb20);
          uVar38 = in_stack_fffffffffffffb1f;
          if (bVar25) {
            bVar25 = in_stack_fffffffffffffb20->number_ < 0x10;
            cVar26 = '\x06';
            in_stack_fffffffffffffb20 = pFVar55;
          }
          else {
            bVar36 = in_stack_fffffffffffffb20->field_0x1;
            bVar25 = (bool)((bVar36 & 0x20) >> 5);
            if (0xbf < bVar36 != bVar25) {
              pcVar35 = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                                  (bVar25,0xbf < bVar36,
                                   "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED");
              absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                        ((LogMessageFatal *)&local_4c8,
                         "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                         ,0xb54,pcVar35);
              goto LAB_004322d8;
            }
            if ((bVar36 & 0x20) == 0) {
              bVar25 = in_stack_fffffffffffffb20->number_ < 0x10;
              cVar26 = '\x02';
              in_stack_fffffffffffffb20 = pFVar55;
            }
            else {
              bVar25 = in_stack_fffffffffffffb20->number_ < 0x10;
              cVar26 = '\x04';
              in_stack_fffffffffffffb20 = pFVar55;
            }
          }
          break;
        case 9:
        case 0xc:
          if (puVar51[-10] == '\x01') {
            bVar40 = in_stack_fffffffffffffb20->field_0x1;
            bVar25 = (bool)((bVar40 & 0x20) >> 5);
            if (0xbf < bVar40 != bVar25) {
              pcVar35 = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                                  (bVar25,0xbf < bVar40,
                                   "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED");
              absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                        ((LogMessageFatal *)&local_4c8,
                         "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                         ,0xb54,pcVar35);
              goto LAB_004322d8;
            }
            if ((bVar40 & 0x20) != 0) {
              absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                        ((LogMessageFatal *)&local_4c8,
                         "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_gen.cc"
                         ,0xa6,"!field->is_repeated()");
              goto LAB_004322d8;
            }
          }
          (*(code *)(&DAT_006cae38 + *(int *)(&DAT_006cae38 + (ulong)(bVar36 - 9) * 4)))();
          return;
        case 10:
          bVar36 = in_stack_fffffffffffffb20->field_0x1;
          bVar25 = (bool)((bVar36 & 0x20) >> 5);
          bVar40 = 0xbf < bVar36 ^ bVar25;
          uVar38 = in_stack_fffffffffffffb1f;
          if (puVar51[-8] == '\x01') {
            if (bVar40 != 0) {
              pcVar35 = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                                  (bVar25,0xbf < bVar36,
                                   "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED");
              absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                        ((LogMessageFatal *)&local_4c8,
                         "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                         ,0xb54,pcVar35);
              goto LAB_004322d8;
            }
            if ((bVar36 & 0x20) == 0) {
              bVar25 = in_stack_fffffffffffffb20->number_ < 0x10;
              cVar26 = 'f';
              in_stack_fffffffffffffb20 = pFVar55;
            }
            else {
              bVar25 = in_stack_fffffffffffffb20->number_ < 0x10;
              cVar26 = 'h';
              in_stack_fffffffffffffb20 = pFVar55;
            }
          }
          else {
            if (bVar40 != 0) {
              pcVar35 = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                                  (bVar25,0xbf < bVar36,
                                   "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED");
              absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                        ((LogMessageFatal *)&local_4c8,
                         "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                         ,0xb54,pcVar35);
              goto LAB_004322d8;
            }
            if ((bVar36 & 0x20) == 0) {
              bVar25 = in_stack_fffffffffffffb20->number_ < 0x10;
              cVar26 = 'b';
              in_stack_fffffffffffffb20 = pFVar55;
            }
            else {
              bVar25 = in_stack_fffffffffffffb20->number_ < 0x10;
              cVar26 = 'd';
              in_stack_fffffffffffffb20 = pFVar55;
            }
          }
          break;
        case 0xb:
          bVar25 = anon_unknown_36::HasLazyRep
                             (in_stack_fffffffffffffb20,
                              (FieldOptions *)(ulong)*(uint *)(puVar51 + -0xc));
          uVar38 = in_stack_fffffffffffffb1f;
          if (bVar25) {
            bVar25 = in_stack_fffffffffffffb20->number_ < 0x10;
            cVar26 = 'r';
            in_stack_fffffffffffffb20 = pFVar55;
          }
          else {
            bVar36 = in_stack_fffffffffffffb20->field_0x1;
            bVar25 = (bool)((bVar36 & 0x20) >> 5);
            if (0xbf < bVar36 != bVar25) {
              pcVar35 = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                                  (bVar25,0xbf < bVar36,
                                   "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED");
              absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                        ((LogMessageFatal *)&local_4c8,
                         "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                         ,0xb54,pcVar35);
              goto LAB_004322d8;
            }
            iVar7 = in_stack_fffffffffffffb20->number_;
            if (puVar51[-8] == '\x01') {
              if ((bVar36 & 0x20) == 0) {
                bVar25 = iVar7 < 0x10;
                cVar26 = 'n';
                in_stack_fffffffffffffb20 = pFVar55;
              }
              else {
                bVar25 = iVar7 < 0x10;
                cVar26 = 'p';
                in_stack_fffffffffffffb20 = pFVar55;
              }
            }
            else if ((bVar36 & 0x20) == 0) {
              bVar25 = iVar7 < 0x10;
              cVar26 = 'j';
              in_stack_fffffffffffffb20 = pFVar55;
            }
            else {
              bVar25 = iVar7 < 0x10;
              cVar26 = 'l';
              in_stack_fffffffffffffb20 = pFVar55;
            }
          }
          break;
        case 0xe:
          bVar25 = anon_unknown_36::TreatEnumAsInt(in_stack_fffffffffffffb20);
          if (bVar25) {
            bVar25 = FieldDescriptor::is_packed(in_stack_fffffffffffffb20);
            pFVar55 = in_stack_fffffffffffffb20;
            if (bVar25) {
              iVar7 = in_stack_fffffffffffffb20->number_;
              goto LAB_00431783;
            }
            bVar36 = in_stack_fffffffffffffb20->field_0x1;
            bVar25 = (bool)((bVar36 & 0x20) >> 5);
            if (0xbf < bVar36 == bVar25) goto LAB_004319b2;
            pcVar35 = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                                (bVar25,0xbf < bVar36,
                                 "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED");
            absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                      ((LogMessageFatal *)&local_4c8,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                       ,0xb54,pcVar35);
            goto LAB_004322d8;
          }
          enum_type = FieldDescriptor::enum_type(in_stack_fffffffffffffb20);
          bVar25 = anon_unknown_36::GetEnumValidationRange
                             (enum_type,(int32_t *)&local_4c8,(int32_t *)&local_458);
          pSVar18 = local_458.
                    super__Vector_base<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock,_std::allocator<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          if (bVar25) {
            uVar27 = local_4c8.skipmap32;
            if (1 < local_4c8.skipmap32 ||
                0x7f < (int)local_458.
                            super__Vector_base<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock,_std::allocator<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock>_>
                            ._M_impl.super__Vector_impl_data._M_start) {
              bVar25 = FieldDescriptor::is_packed(in_stack_fffffffffffffb20);
              if (bVar25) {
                bVar25 = in_stack_fffffffffffffb20->number_ < 0x10;
                cVar26 = '6';
                uVar38 = in_stack_fffffffffffffb1f;
              }
              else {
                bVar25 = FieldDescriptor::is_repeated(in_stack_fffffffffffffb20);
                uVar38 = in_stack_fffffffffffffb1f;
                if (bVar25) {
                  bVar25 = in_stack_fffffffffffffb20->number_ < 0x10;
                  cVar26 = '4';
                }
                else {
                  bVar25 = in_stack_fffffffffffffb20->number_ < 0x10;
                  cVar26 = '2';
                }
              }
              break;
            }
            bVar25 = FieldDescriptor::is_packed(in_stack_fffffffffffffb20);
            if (uVar27 == 0) {
              if (bVar25) {
                bVar25 = in_stack_fffffffffffffb20->number_ < 0x10;
                cVar26 = '<';
              }
              else {
                bVar25 = FieldDescriptor::is_repeated(in_stack_fffffffffffffb20);
                if (bVar25) {
                  bVar25 = in_stack_fffffffffffffb20->number_ < 0x10;
                  cVar26 = ':';
                }
                else {
                  bVar25 = in_stack_fffffffffffffb20->number_ < 0x10;
                  cVar26 = '8';
                }
              }
            }
            else if (bVar25) {
              bVar25 = in_stack_fffffffffffffb20->number_ < 0x10;
              cVar26 = 'B';
            }
            else {
              bVar25 = FieldDescriptor::is_repeated(in_stack_fffffffffffffb20);
              if (bVar25) {
                bVar25 = in_stack_fffffffffffffb20->number_ < 0x10;
                cVar26 = '@';
              }
              else {
                bVar25 = in_stack_fffffffffffffb20->number_ < 0x10;
                cVar26 = '>';
              }
            }
            cVar26 = cVar26 - bVar25;
            uVar38 = SUB81(pSVar18,0);
            goto LAB_00431f6c;
          }
          bVar25 = FieldDescriptor::is_packed(in_stack_fffffffffffffb20);
          uVar38 = in_stack_fffffffffffffb1f;
          if (!bVar25) {
            bVar36 = in_stack_fffffffffffffb20->field_0x1;
            bVar25 = (bool)((bVar36 & 0x20) >> 5);
            if (0xbf < bVar36 == bVar25) {
              if ((bVar36 & 0x20) == 0) {
                bVar25 = in_stack_fffffffffffffb20->number_ < 0x10;
                cVar26 = ',';
              }
              else {
                bVar25 = in_stack_fffffffffffffb20->number_ < 0x10;
                cVar26 = '.';
              }
              break;
            }
            pcVar35 = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                                (bVar25,0xbf < bVar36,
                                 "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED");
            absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                      ((LogMessageFatal *)&local_4c8,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                       ,0xb54,pcVar35);
            goto LAB_004322d8;
          }
          bVar25 = in_stack_fffffffffffffb20->number_ < 0x10;
          cVar26 = '0';
          break;
        case 0x11:
          bVar25 = FieldDescriptor::is_packed(in_stack_fffffffffffffb20);
          uVar38 = in_stack_fffffffffffffb1f;
          if (bVar25) {
            bVar25 = in_stack_fffffffffffffb20->number_ < 0x10;
            cVar26 = '\x18';
            in_stack_fffffffffffffb20 = pFVar55;
          }
          else {
            bVar36 = in_stack_fffffffffffffb20->field_0x1;
            bVar25 = (bool)((bVar36 & 0x20) >> 5);
            if (0xbf < bVar36 != bVar25) {
              pcVar35 = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                                  (bVar25,0xbf < bVar36,
                                   "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED");
              absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                        ((LogMessageFatal *)&local_4c8,
                         "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                         ,0xb54,pcVar35);
              goto LAB_004322d8;
            }
            if ((bVar36 & 0x20) == 0) {
              bVar25 = in_stack_fffffffffffffb20->number_ < 0x10;
              cVar26 = '\x14';
              in_stack_fffffffffffffb20 = pFVar55;
            }
            else {
              bVar25 = in_stack_fffffffffffffb20->number_ < 0x10;
              cVar26 = '\x16';
              in_stack_fffffffffffffb20 = pFVar55;
            }
          }
          break;
        case 0x12:
          bVar25 = FieldDescriptor::is_packed(in_stack_fffffffffffffb20);
          uVar38 = in_stack_fffffffffffffb1f;
          if (bVar25) {
            bVar25 = in_stack_fffffffffffffb20->number_ < 0x10;
            cVar26 = '\x1e';
            in_stack_fffffffffffffb20 = pFVar55;
          }
          else {
            bVar36 = in_stack_fffffffffffffb20->field_0x1;
            bVar25 = (bool)((bVar36 & 0x20) >> 5);
            if (0xbf < bVar36 != bVar25) {
              pcVar35 = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                                  (bVar25,0xbf < bVar36,
                                   "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED");
              absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                        ((LogMessageFatal *)&local_4c8,
                         "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                         ,0xb54,pcVar35);
              goto LAB_004322d8;
            }
            if ((bVar36 & 0x20) == 0) {
              bVar25 = in_stack_fffffffffffffb20->number_ < 0x10;
              cVar26 = '\x1a';
              in_stack_fffffffffffffb20 = pFVar55;
            }
            else {
              bVar25 = in_stack_fffffffffffffb20->number_ < 0x10;
              cVar26 = '\x1c';
              in_stack_fffffffffffffb20 = pFVar55;
            }
          }
        }
        cVar26 = cVar26 - bVar25;
        in_stack_fffffffffffffb1f = uVar38;
LAB_00431f6c:
        uVar6 = *(undefined4 *)(puVar51 + -0x10);
        *(char *)&(local_468->
                  super__Variant_base<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
                  ).
                  super__Move_assign_alias<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
                  .
                  super__Copy_assign_alias<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
                  .
                  super__Move_ctor_alias<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
                  .
                  super__Copy_ctor_alias<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
                  .
                  super__Variant_storage_alias<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
                  ._M_u = cVar26;
        *(undefined8 *)
         ((long)&(local_468->
                 super__Variant_base<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
                 ).
                 super__Move_assign_alias<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
                 .
                 super__Copy_assign_alias<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
                 .
                 super__Move_ctor_alias<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
                 .
                 super__Copy_ctor_alias<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
                 .
                 super__Variant_storage_alias<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
                 ._M_u + 1) = 0;
        *(undefined8 *)
         ((long)&(local_468->
                 super__Variant_base<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
                 ).
                 super__Move_assign_alias<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
                 .
                 super__Copy_assign_alias<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
                 .
                 super__Move_ctor_alias<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
                 .
                 super__Copy_ctor_alias<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
                 .
                 super__Variant_storage_alias<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
                 ._M_u + 9) = 0;
        *(undefined2 *)
         ((long)&(local_468->
                 super__Variant_base<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
                 ).
                 super__Move_assign_alias<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
                 .
                 super__Copy_assign_alias<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
                 .
                 super__Move_ctor_alias<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
                 .
                 super__Copy_ctor_alias<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
                 .
                 super__Variant_storage_alias<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
                 ._M_u + 0x11) = 0;
        *(undefined1 *)
         ((long)&(local_468->
                 super__Variant_base<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
                 ).
                 super__Move_assign_alias<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
                 .
                 super__Copy_assign_alias<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
                 .
                 super__Move_ctor_alias<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
                 .
                 super__Copy_ctor_alias<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
                 .
                 super__Variant_storage_alias<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
                 ._M_u + 0x13) = uVar38;
        *(undefined4 *)
         ((long)&(local_468->
                 super__Variant_base<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
                 ).
                 super__Move_assign_alias<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
                 .
                 super__Copy_assign_alias<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
                 .
                 super__Move_ctor_alias<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
                 .
                 super__Copy_ctor_alias<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
                 .
                 super__Variant_storage_alias<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
                 ._M_u + 0x14) = uVar6;
        (local_468->
        super__Variant_base<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
        ).
        super__Move_assign_alias<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
        .
        super__Copy_assign_alias<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
        .
        super__Move_ctor_alias<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
        .
        super__Copy_ctor_alias<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
        .
        super__Variant_storage_alias<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
        ._M_index = '\x01';
        pvVar34 = std::
                  get<1ul,google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
                            (local_468);
        pvVar34->field = local_460;
        pvVar34->coded_tag = (uint16_t)local_47c;
        iVar7 = *(int *)((long)&pFVar54->hasbit_idx + lVar53);
        uVar37 = (uint8_t)iVar7;
        if (iVar7 < 0) {
          uVar37 = '?';
        }
        pvVar34->hasbit_idx = uVar37;
        uVar44 = uVar44 | (uint)(0.05 <= *(float *)(puVar51 + -0x10)) << ((byte)local_480 & 0x1f);
      }
LAB_004315f8:
      pFVar43 = (pointer)((long)&pFVar43->field + 1);
      pFVar54 = (local_490->field_entries).
                super__Vector_base<google::protobuf::internal::TailCallTableInfo::FieldEntryInfo,_std::allocator<google::protobuf::internal::TailCallTableInfo::FieldEntryInfo>_>
                ._M_impl.super__Vector_impl_data._M_start;
      puVar51 = puVar51 + 0x20;
      lVar53 = lVar53 + 0x18;
      pFVar55 = in_stack_fffffffffffffb20;
    } while (pFVar43 < (pointer)(((long)(local_490->field_entries).
                                        super__Vector_base<google::protobuf::internal::TailCallTableInfo::FieldEntryInfo,_std::allocator<google::protobuf::internal::TailCallTableInfo::FieldEntryInfo>_>
                                        ._M_impl.super__Vector_impl_data._M_finish - (long)pFVar54
                                 >> 3) * -0x5555555555555555));
  }
  uVar41 = local_478;
  if (1 < (uint)local_478) {
    pFVar48 = (pointer)local_438;
    uVar50 = local_478;
    do {
      uVar52 = uVar50 >> 1;
      uVar29 = uVar44 >> ((byte)uVar52 & 0x1f);
      uVar41 = uVar50;
      if (((uVar29 & uVar44) != 0) || (uVar41 = uVar52, uVar50 < 2)) break;
      uVar47 = 0;
      pFVar43 = pFVar48;
      do {
        if (((uVar44 >> ((int)uVar52 + (int)uVar47 & 0x1fU) & 1) != 0) ||
           ((char)pFVar43->inlined_string_index == '\0')) {
          pFVar5 = pFVar43 + uVar52;
          pFVar55 = pFVar5->field;
          iVar7 = pFVar5->has_bit_index;
          fVar23 = pFVar5->presence_probability;
          pFVar5 = pFVar43 + uVar52;
          bVar25 = pFVar5->is_string_inlined;
          bVar19 = pFVar5->is_implicitly_weak;
          bVar20 = pFVar5->use_direct_tcparser_table;
          bVar21 = pFVar5->should_split;
          uVar22 = *(undefined2 *)&pFVar5->field_0x16;
          uVar15 = *(undefined8 *)(&pFVar5->lazy_opt + 4);
          pFVar43->lazy_opt = pFVar5->lazy_opt;
          pFVar43->is_string_inlined = bVar25;
          pFVar43->is_implicitly_weak = bVar19;
          pFVar43->use_direct_tcparser_table = bVar20;
          pFVar43->should_split = bVar21;
          *(undefined2 *)&pFVar43->field_0x16 = uVar22;
          *(undefined8 *)&pFVar43->inlined_string_index = uVar15;
          pFVar43->field = pFVar55;
          pFVar43->has_bit_index = iVar7;
          pFVar43->presence_probability = fVar23;
        }
        uVar47 = uVar47 + 1;
        pFVar43 = pFVar43 + 1;
      } while (uVar52 != uVar47);
      uVar44 = uVar44 | uVar29;
      bVar25 = 3 < uVar50;
      uVar50 = uVar52;
    } while (bVar25);
  }
  std::
  vector<google::protobuf::internal::TailCallTableInfo::FastFieldInfo,std::allocator<google::protobuf::internal::TailCallTableInfo::FastFieldInfo>>
  ::_M_assign_aux<google::protobuf::internal::TailCallTableInfo::FastFieldInfo*>
            ((vector<google::protobuf::internal::TailCallTableInfo::FastFieldInfo,std::allocator<google::protobuf::internal::TailCallTableInfo::FastFieldInfo>>
              *)pvVar1,local_438,local_438 + uVar41 * 0x20);
  pTVar46 = local_490;
  pFVar43 = local_4a8;
  if (uVar41 == 0) {
    uVar29 = 0x40;
  }
  else {
    lVar53 = 0x3f;
    if (uVar41 != 0) {
      for (; uVar41 >> lVar53 == 0; lVar53 = lVar53 + -1) {
      }
    }
    uVar29 = (uint)lVar53 ^ 0x3f;
  }
  ordered_fields_00.len_._0_4_ = 0x3f - uVar29;
  local_490->table_size_log2 = (int)ordered_fields_00.len_;
  ordered_fields_00.ptr_ = local_4a8;
  ordered_fields_00.len_._4_4_ = 0;
  anon_unknown_36::MakeNumToEntryTable(&local_4c8,(anon_unknown_36 *)local_498,ordered_fields_00);
  (pTVar46->num_to_entry_table).skipmap32 = local_4c8.skipmap32;
  local_458.
  super__Vector_base<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock,_std::allocator<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pTVar46->num_to_entry_table).blocks.
       super__Vector_base<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock,_std::allocator<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (pTVar46->num_to_entry_table).blocks.
  super__Vector_base<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock,_std::allocator<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_4c8.blocks.
       super__Vector_base<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock,_std::allocator<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_458.
  super__Vector_base<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock,_std::allocator<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pTVar46->num_to_entry_table).blocks.
       super__Vector_base<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock,_std::allocator<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_458.
  super__Vector_base<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock,_std::allocator<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (pTVar46->num_to_entry_table).blocks.
       super__Vector_base<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock,_std::allocator<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  (pTVar46->num_to_entry_table).blocks.
  super__Vector_base<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock,_std::allocator<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock>_>
  ._M_impl.super__Vector_impl_data._M_start =
       local_4c8.blocks.
       super__Vector_base<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock,_std::allocator<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (pTVar46->num_to_entry_table).blocks.
  super__Vector_base<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock,_std::allocator<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_4c8.blocks.
       super__Vector_base<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock,_std::allocator<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_4c8.blocks.
  super__Vector_base<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock,_std::allocator<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_4c8.blocks.
  super__Vector_base<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock,_std::allocator<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_4c8.blocks.
  super__Vector_base<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock,_std::allocator<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock,_std::allocator<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock>_>
  ::~vector(&local_458);
  std::
  vector<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock,_std::allocator<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock>_>
  ::~vector(&local_4c8.blocks);
  pFVar54 = (pTVar46->field_entries).
            super__Vector_base<google::protobuf::internal::TailCallTableInfo::FieldEntryInfo,_std::allocator<google::protobuf::internal::TailCallTableInfo::FieldEntryInfo>_>
            ._M_impl.super__Vector_impl_data._M_start;
  v1 = ((long)(pTVar46->field_entries).
              super__Vector_base<google::protobuf::internal::TailCallTableInfo::FieldEntryInfo,_std::allocator<google::protobuf::internal::TailCallTableInfo::FieldEntryInfo>_>
              ._M_impl.super__Vector_impl_data._M_finish - (long)pFVar54 >> 3) * -0x5555555555555555
  ;
  if (v1 - (long)pFVar43 == 0) {
    fields_00.ptr_._7_1_ = in_stack_fffffffffffffb1f;
    fields_00.ptr_._0_7_ = in_stack_fffffffffffffb18;
    fields_00.len_ = (size_type)in_stack_fffffffffffffb20;
    entries_00.len_ = (size_type)pFVar43;
    entries_00.ptr_ = pFVar54;
    anon_unknown_36::GenerateFieldNames
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_4c8,local_488,
               entries_00,(MessageOptions *)pFVar48,fields_00);
    puVar10 = (pTVar46->field_name_data).
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start;
    puVar11 = (pTVar46->field_name_data).
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage;
    (pTVar46->field_name_data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)local_4c8._0_8_;
    (pTVar46->field_name_data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_finish =
         (pointer)local_4c8.blocks.
                  super__Vector_base<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock,_std::allocator<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock>_>
                  ._M_impl.super__Vector_impl_data._M_start;
    (pTVar46->field_name_data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)local_4c8.blocks.
                  super__Vector_base<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock,_std::allocator<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
    local_4c8._0_8_ = (FieldDescriptor *)0x0;
    local_4c8.blocks.
    super__Vector_base<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock,_std::allocator<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_4c8.blocks.
    super__Vector_base<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock,_std::allocator<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    if (puVar10 == (pointer)0x0) {
      return;
    }
    operator_delete(puVar10,(long)puVar11 - (long)puVar10);
    auVar17 = (undefined1  [8])local_4c8._0_8_;
    pSVar18 = local_4c8.blocks.
              super__Vector_base<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock,_std::allocator<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock>_>
              ._M_impl.super__Vector_impl_data._M_finish;
joined_r0x0043219b:
    if (auVar17 != (undefined1  [8])0x0) {
      operator_delete((void *)auVar17,(long)pSVar18 - (long)auVar17);
    }
    return;
  }
  pcVar35 = absl::lts_20250127::log_internal::MakeCheckOpString<unsigned_long,unsigned_long>
                      (v1,(unsigned_long)pFVar43,"field_entries.size() == ordered_fields.size()");
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)&local_4c8,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_gen.cc"
             ,0x407,pcVar35);
LAB_004322d8:
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_4c8)
  ;
}

Assistant:

TailCallTableInfo::TailCallTableInfo(
    const Descriptor* descriptor, const MessageOptions& message_options,
    absl::Span<const FieldOptions> ordered_fields) {
  fallback_function =
      // Map entries discard unknown data
      descriptor->options().map_entry()
          ? TcParseFunction::kDiscardEverythingFallback
      // Reflection and weak messages have the reflection fallback
      : !message_options.uses_codegen || HasWeakFields(descriptor)
          ? TcParseFunction::kReflectionFallback
      // Codegen messages have lite and non-lite version
      : message_options.is_lite ? TcParseFunction::kGenericFallbackLite
                                : TcParseFunction::kGenericFallback;

  if (descriptor->options().message_set_wire_format()) {
    ABSL_DCHECK(ordered_fields.empty());
    if (message_options.uses_codegen) {
      fast_path_fields = {{TailCallTableInfo::FastFieldInfo::NonField{
          message_options.is_lite
              ? TcParseFunction::kMessageSetWireFormatParseLoopLite
              : TcParseFunction::kMessageSetWireFormatParseLoop,
          0, 0}}};

      aux_entries = {{kSelfVerifyFunc}};
    } else {
      ABSL_DCHECK(!message_options.is_lite);
      // The message set parser loop only handles codegen because it hardcodes
      // the generated extension registry. For reflection, use the reflection
      // loop which can handle arbitrary message factories.
      fast_path_fields = {{TailCallTableInfo::FastFieldInfo::NonField{
          TcParseFunction::kReflectionParseLoop, 0, 0}}};
    }

    table_size_log2 = 0;
    num_to_entry_table = MakeNumToEntryTable(ordered_fields);
    field_name_data = GenerateFieldNames(descriptor, field_entries,
                                         message_options, ordered_fields);

    return;
  }

  ABSL_DCHECK(std::is_sorted(ordered_fields.begin(), ordered_fields.end(),
                             [](const auto& lhs, const auto& rhs) {
                               return lhs.field->number() < rhs.field->number();
                             }));
  // If this message has any inlined string fields, store the donation state
  // offset in the first auxiliary entry, which is kInlinedStringAuxIdx.
  if (std::any_of(ordered_fields.begin(), ordered_fields.end(),
                  [](auto& f) { return f.is_string_inlined; })) {
    aux_entries.resize(kInlinedStringAuxIdx + 1);  // Allocate our slot
    aux_entries[kInlinedStringAuxIdx] = {kInlinedStringDonatedOffset};
  }

  // If this message is split, store the split pointer offset in the second
  // and third auxiliary entries, which are kSplitOffsetAuxIdx and
  // kSplitSizeAuxIdx.
  if (std::any_of(ordered_fields.begin(), ordered_fields.end(),
                  [](auto& f) { return f.should_split; })) {
    static_assert(kSplitOffsetAuxIdx + 1 == kSplitSizeAuxIdx, "");
    aux_entries.resize(kSplitSizeAuxIdx + 1);  // Allocate our 2 slots
    aux_entries[kSplitOffsetAuxIdx] = {kSplitOffset};
    aux_entries[kSplitSizeAuxIdx] = {kSplitSizeof};
  }

  field_entries = BuildFieldEntries(descriptor, message_options, ordered_fields,
                                    aux_entries);

  auto end_group_tag = GetEndGroupTag(descriptor);

  FastFieldInfo fast_fields[TcParseTableBase::kMaxFastFields];
  // Bit mask for the fields that are "important". Unimportant fields might be
  // set but it's ok if we lose them from the fast table. For example, cold
  // fields.
  uint32_t important_fields = 0;
  static_assert(
      sizeof(important_fields) * 8 >= TcParseTableBase::kMaxFastFields, "");
  // The largest table we allow has the same number of entries as the
  // message has fields, rounded up to the next power of 2 (e.g., a message
  // with 5 fields can have a fast table of size 8). A larger table *might*
  // cover more fields in certain cases, but a larger table in that case
  // would have mostly empty entries; so, we cap the size to avoid
  // pathologically sparse tables.
  // However, if this message uses group encoding, the tables are sometimes very
  // sparse because the fields in the group avoid using the same field
  // numbering as the parent message (even though currently, the proto
  // compiler allows the overlap, and there is no possible conflict.)
  // NOTE: The +1 is to maintain the existing behavior that does not match the
  // documented one. When the number of fields is exactly a power of two we
  // allow double that.
  size_t num_fast_fields =
      FastParseTableSize(ordered_fields.size(), end_group_tag);
  PopulateFastFields(
      end_group_tag, field_entries, message_options, ordered_fields,
      absl::MakeSpan(fast_fields, num_fast_fields), important_fields);
  // If we can halve the table without dropping important fields, do it.
  while (num_fast_fields > 1 &&
         (important_fields & (important_fields >> num_fast_fields / 2)) == 0) {
    // Half the table by merging fields.
    num_fast_fields /= 2;
    for (size_t i = 0; i < num_fast_fields; ++i) {
      size_t merge_i = i + num_fast_fields;
      // Overwrite the surviving entries if the discarded half contains an
      // important field (meaning the surviving entry is not) or the surviving
      // entry is empty.
      if (((important_fields >> merge_i) & 1) != 0 ||
          fast_fields[i].is_empty()) {
        fast_fields[i] = fast_fields[merge_i];
      }
    }
    important_fields |= important_fields >> num_fast_fields;
  }

  fast_path_fields.assign(fast_fields, fast_fields + num_fast_fields);
  table_size_log2 = absl::bit_width(num_fast_fields) - 1;

  num_to_entry_table = MakeNumToEntryTable(ordered_fields);
  ABSL_CHECK_EQ(field_entries.size(), ordered_fields.size());
  field_name_data = GenerateFieldNames(descriptor, field_entries,
                                       message_options, ordered_fields);
}